

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O3

int mpc_test_fail(mpc_parser_t *p,char *s,void *d,_func_int_void_ptr_void_ptr *tester,
                 mpc_dtor_t destructor,_func_void_void_ptr *printer)

{
  int iVar1;
  mpc_result_t in_RAX;
  mpc_input_t *i;
  uint uVar2;
  mpc_result_t r;
  mpc_result_t local_38;
  
  local_38 = in_RAX;
  i = mpc_input_new_string("<test>",s);
  iVar1 = mpc_parse_input(i,p,&local_38);
  mpc_input_delete(i);
  if (iVar1 == 0) {
    mpc_err_delete(local_38.error);
    uVar2 = 1;
  }
  else {
    iVar1 = (*tester)(local_38.error,d);
    uVar2 = (uint)(iVar1 == 0);
    (*destructor)(local_38.error);
  }
  return uVar2;
}

Assistant:

int mpc_test_fail(mpc_parser_t *p, const char *s, const void *d,
  int(*tester)(const void*, const void*),
  mpc_dtor_t destructor,
  void(*printer)(const void*)) {
  mpc_result_t r;
  (void) printer;
  if (mpc_parse("<test>", s, p, &r)) {

    if (tester(r.output, d)) {
      destructor(r.output);
      return 0;
    } else {
      destructor(r.output);
      return 1;
    }

  } else {
    mpc_err_delete(r.error);
    return 1;
  }

}